

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int schemasTest(char *filename,char *resul,char *errr,int options)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  undefined8 uVar7;
  long lVar8;
  size_t sVar9;
  char *pcVar10;
  void *pvVar11;
  void *ctx;
  ulong uVar12;
  int iVar13;
  long lVar14;
  glob_t globbuf;
  char prefix [500];
  char err [500];
  char pattern [500];
  int local_6a0;
  glob64_t local_670;
  undefined1 local_628 [512];
  char local_428 [499];
  undefined1 local_235;
  char local_228 [499];
  undefined1 local_35;
  
  pcVar6 = baseFilename(filename);
  uVar7 = xmlSchemaNewParserCtxt(filename);
  xmlSchemaSetParserStructuredErrors(uVar7,testStructuredErrorHandler,0);
  lVar8 = xmlSchemaParse(uVar7);
  xmlSchemaFreeParserCtxt(uVar7);
  iVar2 = testErrorsSize;
  sVar9 = strlen(pcVar6);
  iVar3 = (int)sVar9;
  iVar13 = -1;
  if (0xfffffe10 < iVar3 - 500U) {
    iVar13 = iVar3 + -6;
    if (pcVar6[(long)iVar3 + -6] != '_') {
      iVar13 = iVar3 + -4;
    }
    if (pcVar6[(long)iVar13 + -2] == '_') {
      iVar13 = iVar13 + -2;
    }
    sVar9 = (size_t)iVar13;
    memcpy(local_628,pcVar6,sVar9);
    local_628[sVar9] = 0;
    iVar3 = snprintf(local_228,499,"./test/schemas/%s_*.xml",local_628);
    if (0x1f2 < iVar3) {
      local_35 = 0;
    }
    if (pcVar6[sVar9] == '_') {
      memcpy(local_628,pcVar6,sVar9 + 2);
      local_628[sVar9 + 2] = 0;
    }
    local_670.gl_offs = 0;
    iVar13 = 0;
    glob64(local_228,8,(__errfunc *)0x0,&local_670);
    if (local_670.gl_pathc != 0) {
      uVar12 = 0;
      iVar13 = 0;
      do {
        testErrorsSize = iVar2;
        testErrors[iVar2] = '\0';
        pcVar6 = local_670.gl_pathv[uVar12];
        pcVar10 = baseFilename(pcVar6);
        sVar9 = strlen(pcVar10);
        iVar3 = (int)sVar9;
        if ((iVar3 < 7) || (pcVar10[iVar3 - 6] != '_')) {
          fprintf(_stderr,"don\'t know how to process %s\n",pcVar6);
        }
        else {
          iVar4 = snprintf(local_428,499,"result/schemas/%s_%c.err",local_628,
                           (ulong)(uint)(int)pcVar10[iVar3 - 5]);
          iVar3 = testErrorsSize;
          if (0x1f2 < iVar4) {
            local_235 = 0;
          }
          nb_tests = nb_tests + 1;
          lVar14 = (long)testErrorsSize;
          local_6a0 = 0;
          iVar4 = 1;
          do {
            testErrorsSize = iVar3;
            testErrors[lVar14] = '\0';
            if (lVar8 == 0) {
LAB_0010a927:
              iVar5 = compareFileMem(local_428,testErrors,testErrorsSize);
              bVar1 = true;
              if (iVar5 != 0) {
                fprintf(_stderr,"Error for %s on %s failed\n",pcVar6,filename);
                local_6a0 = 1;
              }
            }
            else {
              pvVar11 = (void *)xmlSchemaNewValidCtxt(lVar8);
              xmlSchemaSetValidStructuredErrors(pvVar11,testStructuredErrorHandler,0);
              if (iVar4 != 1) {
                ctx = pvVar11;
                iVar5 = xmlSchemaValidateFile(pvVar11,pcVar6,options);
LAB_0010a8ea:
                pcVar10 = "%s validation generated an internal error\n";
                if (0 < iVar5) {
                  pcVar10 = "%s fails to validate\n";
                }
                if (iVar5 == 0) {
                  pcVar10 = "%s validates\n";
                }
                testErrorHandler(ctx,pcVar10,pcVar6);
                xmlSchemaFreeValidCtxt(pvVar11);
                goto LAB_0010a927;
              }
              ctx = (void *)xmlReadFile(pcVar6,0,options);
              if (ctx != (void *)0x0) {
                iVar5 = xmlSchemaValidateDoc(pvVar11,ctx);
                xmlFreeDoc();
                goto LAB_0010a8ea;
              }
              fprintf(_stderr,"failed to parse instance %s for %s\n",pcVar6,filename);
              bVar1 = false;
            }
            if (!bVar1) {
              local_6a0 = -1;
              break;
            }
            iVar4 = iVar4 + -1;
          } while (iVar4 == 0);
          if (local_6a0 != 0) {
            iVar13 = local_6a0;
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < local_670.gl_pathc);
    }
    globfree64(&local_670);
  }
  xmlSchemaFree(lVar8);
  return iVar13;
}

Assistant:

static int
schemasTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    xmlSchemaParserCtxtPtr ctxt;
    xmlSchemaPtr schemas;
    int res = 0, len, ret;
    int parseErrorsSize;
    char pattern[500];
    char prefix[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;

    /* first compile the schemas if possible */
    ctxt = xmlSchemaNewParserCtxt(filename);
    xmlSchemaSetParserStructuredErrors(ctxt, testStructuredErrorHandler, NULL);
    schemas = xmlSchemaParse(ctxt);
    xmlSchemaFreeParserCtxt(ctxt);
    parseErrorsSize = testErrorsSize;

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
        xmlSchemaFree(schemas);
	return(-1);
    }
    len -= 4; /* remove trailing .xsd */
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(pattern, 499, "./test/schemas/%s_*.xml", prefix) >= 499)
        pattern[499] = 0;

    if (base[len] == '_') {
        len += 2;
	memcpy(prefix, base, len);
	prefix[len] = 0;
    }

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = parseErrorsSize;
        testErrors[parseErrorsSize] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(err, 499, "result/schemas/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}

        nb_tests++;
        ret = schemasOneTest(filename, instance, err, options, schemas);
        if (ret != 0)
            res = ret;
    }
    globfree(&globbuf);
    xmlSchemaFree(schemas);

    return(res);
}